

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

void crnlib::RcTree_Encode(CRangeEnc *rc,UInt16 *probs,int numBitLevels,UInt32 symbol)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = 1;
  for (uVar1 = numBitLevels - 1; uVar1 != 0xffffffff; uVar1 = uVar1 - 1) {
    bVar3 = (symbol >> (uVar1 & 0x1f) & 1) != 0;
    RangeEnc_EncodeBit(rc,probs + uVar2,(uint)bVar3);
    uVar2 = (ulong)((uint)bVar3 + (int)uVar2 * 2);
  }
  return;
}

Assistant:

static void RcTree_Encode(CRangeEnc* rc, CLzmaProb* probs, int numBitLevels, UInt32 symbol) {
  UInt32 m = 1;
  int i;
  for (i = numBitLevels; i != 0;) {
    UInt32 bit;
    i--;
    bit = (symbol >> i) & 1;
    RangeEnc_EncodeBit(rc, probs + m, bit);
    m = (m << 1) | bit;
  }
}